

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O2

SCCResult * __thiscall
StrongConnectedComponents::getAdjacencyList(StrongConnectedComponents *this,int node)

{
  pointer piVar1;
  pointer pvVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  _Bvector_impl *p_Var5;
  bool bVar6;
  size_type __new_size;
  vector<int,_std::allocator<int>_> *vec;
  pointer *ppiVar7;
  size_type sVar8;
  ulong __n;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar9;
  int node_local;
  bool local_35;
  int local_34;
  
  __new_size = ((long)(this->adjListOriginal->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->adjListOriginal->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  node_local = node;
  std::vector<int,_std::allocator<int>_>::resize(&this->lowlink,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->number,__new_size);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->visited,__new_size,false);
  p_Var5 = &(this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar3 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar4;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
  local_35 = false;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,&local_35);
  piVar1 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&this->currentSCCs);
  makeAdjListSubgraph(this,node);
  __n = (ulong)node;
  do {
    if (__new_size <= __n) {
      return &sccr_dummy;
    }
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->visited,__n);
    if ((*rVar9._M_p & rVar9._M_mask) == 0) {
      getStrongConnectedComponents(this,(int)__n);
      vec = getLowestIdComponent(this);
      if (vec != (vector<int,_std::allocator<int>_> *)0x0) {
        if (((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start !=
             (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish) && (bVar6 = find_vec<int>(vec,&node_local), !bVar6)) {
          local_34 = node_local + 1;
          bVar6 = find_vec<int>(vec,&local_34);
          if (!bVar6) {
            node_local = node_local + 1;
            goto LAB_00169423;
          }
        }
        buildAdjList(this,vec,&this->sccr_current);
        pvVar2 = (this->sccr_current).adjList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pvVar2 != (this->sccr_current).adjList.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          ppiVar7 = &(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          for (sVar8 = 0; __new_size != sVar8; sVar8 = sVar8 + 1) {
            if (((_Vector_impl_data *)(ppiVar7 + -1))->_M_start != *ppiVar7) {
              (this->sccr_current).lowestNodeId = (ID_type)sVar8;
              return &this->sccr_current;
            }
            ppiVar7 = ppiVar7 + 3;
          }
        }
      }
    }
LAB_00169423:
    __n = __n + 1;
  } while( true );
}

Assistant:

SCCResult& StrongConnectedComponents::getAdjacencyList(int node) {
    auto adjListOriginal_s = adjListOriginal.size();
    lowlink.resize(adjListOriginal_s);
    number.resize(adjListOriginal_s);
    visited.resize(adjListOriginal_s);

    while (true) {
        std::fill(visited.begin(), visited.end(), false);
        stack.clear();
        currentSCCs.clear();

        makeAdjListSubgraph(node);
        for (int i = node; i < adjListOriginal_s; i++) {
            if (!visited[i]) {
                getStrongConnectedComponents(i);
                const std::vector<int>* nodes = getLowestIdComponent();
                if (nodes != nullptr && !nodes->empty() && !find_vec(*nodes, node) &&
                    !find_vec(*nodes, node + 1)) {
                    node++;
                    continue;
                }
                else if (nodes != nullptr) {
                    buildAdjList(*nodes, sccr_current);
                    auto& adjacencyList = sccr_current.getAdjListForWrite();
                    if (!adjacencyList.empty()) {
                        for (int j = 0; j < adjListOriginal_s; j++) {
                            if (!adjacencyList[j].empty()) {
                                sccr_current.setLowestNodeId(j);
                                return sccr_current;
                            }
                        }
                    }
                }
            }
        }
        return sccr_dummy;
    }
}